

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataBuffer.cpp
# Opt level: O0

void __thiscall DataBuffer::writeStringIndex(DataBuffer *this,String *a)

{
  int data;
  String *a_local;
  DataBuffer *this_local;
  
  writeHeader(this,PushStringIndex);
  data = getStringTableIndex(a);
  writeDWord(this,data);
  return;
}

Assistant:

void DataBuffer::writeStringIndex (const String& a)
{
	writeHeader (DataHeader::PushStringIndex);
	writeDWord (getStringTableIndex (a));
}